

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O1

int __thiscall Wave::get_min_entropy(Wave *this,minstd_rand *gen)

{
  double dVar1;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double local_38;
  
  iVar2 = -2;
  if (this->is_impossible == false) {
    if (this->size == 0) {
      iVar2 = -1;
    }
    else {
      dVar1 = this->min_abs_half_plogp;
      uVar3 = 0xffffffff;
      local_38 = INFINITY;
      uVar4 = 0;
      do {
        if (((this->memoisation).nb_patterns.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4] != 1) &&
           (dVar6 = (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar4], dVar6 <= local_38)) {
          dVar5 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                            (gen);
          dVar6 = dVar6 + dVar5 * dVar1 + 0.0;
          if (dVar6 < local_38) {
            uVar3 = uVar4 & 0xffffffff;
            local_38 = dVar6;
          }
        }
        iVar2 = (int)uVar3;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->size);
    }
  }
  return iVar2;
}

Assistant:

int Wave::get_min_entropy(std::minstd_rand &gen) const noexcept {
  if (is_impossible) {
    return -2;
  }

  std::uniform_real_distribution<> dis(0, min_abs_half_plogp);

  // The minimum entropy (plus a small noise)
  double min = std::numeric_limits<double>::infinity();
  int argmin = -1;

  for (unsigned i = 0; i < size; i++) {

    // If the cell is decided, we do not compute the entropy (which is equal
    // to 0).
    double nb_patterns_local = memoisation.nb_patterns[i];
    if (nb_patterns_local == 1) {
      continue;
    }

    // Otherwise, we take the memoised entropy.
    double entropy = memoisation.entropy[i];

    // We first check if the entropy is less than the minimum.
    // This is important to reduce noise computation (which is not
    // negligible).
    if (entropy <= min) {

      // Then, we add noise to decide randomly which will be chosen.
      // noise is smaller than the smallest p * log(p), so the minimum entropy
      // will always be chosen.
      double noise = dis(gen);
      if (entropy + noise < min) {
        min = entropy + noise;
        argmin = i;
      }
    }
  }

  return argmin;
}